

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_19::BinaryReader::ReadSections(BinaryReader *this)

{
  BinarySection BVar1;
  bool bVar2;
  char *pcVar3;
  Result local_60;
  byte local_59;
  Result section_result;
  bool stop_on_first_error;
  BinarySection section;
  undefined1 local_40 [8];
  ReadEndRestoreGuard guard;
  Offset local_28;
  Offset section_size;
  uint32_t section_code;
  Result result;
  BinaryReader *this_local;
  
  _section_code = this;
  Result::Result((Result *)((long)&section_size + 4),Ok);
  do {
    if ((this->state_).size <= (this->state_).offset) {
      return (Result)section_size._4_4_;
    }
    guard.previous_value_._4_4_ = ReadU32Leb128(this,(uint32_t *)&section_size,"section code");
    bVar2 = Failed(guard.previous_value_._4_4_);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    guard.previous_value_._0_4_ = ReadOffset(this,&local_28,"section size");
    bVar2 = Failed(guard.previous_value_._0_4_);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
    ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                       *)local_40,this);
    BVar1 = (BinarySection)section_size;
    this->read_end_ = (this->state_).offset + local_28;
    if ((BinarySection)section_size < Invalid) {
      if ((this->state_).size < this->read_end_) {
        PrintError(this,"invalid section size: extends past end");
        Result::Result((Result *)((long)&this_local + 4),Error);
        bVar2 = true;
      }
      else if (((this->last_known_section_ == Invalid) || ((BinarySection)section_size == Custom))
              || ((int)this->last_known_section_ < (int)(BinarySection)section_size)) {
        if (((this->did_read_names_section_ & 1U) == 0) || ((BinarySection)section_size == Custom))
        {
          section_result.enum_ =
               (*this->delegate_->_vptr_BinaryReaderDelegate[6])
                         (this->delegate_,(ulong)(BinarySection)section_size,local_28);
          bVar2 = Succeeded(section_result);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            local_59 = this->options_->stop_on_first_error & 1;
            Result::Result(&local_60,Error);
            switch(BVar1) {
            case Custom:
              local_60 = ReadCustomSection(this,local_28);
              if ((this->options_->fail_on_custom_section_error & 1U) == 0) {
                local_59 = 0;
              }
              else {
                Result::operator|=((Result *)((long)&section_size + 4),local_60);
              }
              break;
            case Type:
              local_60 = ReadTypeSection(this,local_28);
              Result::operator|=((Result *)((long)&section_size + 4),local_60);
              break;
            case Import:
              local_60 = ReadImportSection(this,local_28);
              Result::operator|=((Result *)((long)&section_size + 4),local_60);
              break;
            case Function:
              local_60 = ReadFunctionSection(this,local_28);
              Result::operator|=((Result *)((long)&section_size + 4),local_60);
              break;
            case Table:
              local_60 = ReadTableSection(this,local_28);
              Result::operator|=((Result *)((long)&section_size + 4),local_60);
              break;
            case Memory:
              local_60 = ReadMemorySection(this,local_28);
              Result::operator|=((Result *)((long)&section_size + 4),local_60);
              break;
            case Global:
              local_60 = ReadGlobalSection(this,local_28);
              Result::operator|=((Result *)((long)&section_size + 4),local_60);
              break;
            case Export:
              local_60 = ReadExportSection(this,local_28);
              Result::operator|=((Result *)((long)&section_size + 4),local_60);
              break;
            case Start:
              local_60 = ReadStartSection(this,local_28);
              Result::operator|=((Result *)((long)&section_size + 4),local_60);
              break;
            case Elem:
              local_60 = ReadElemSection(this,local_28);
              Result::operator|=((Result *)((long)&section_size + 4),local_60);
              break;
            case Code:
              local_60 = ReadCodeSection(this,local_28);
              Result::operator|=((Result *)((long)&section_size + 4),local_60);
              break;
            case Data:
              local_60 = ReadDataSection(this,local_28);
              Result::operator|=((Result *)((long)&section_size + 4),local_60);
            }
            bVar2 = Failed(local_60);
            if (bVar2) {
              if ((local_59 & 1) != 0) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar2 = true;
                goto LAB_0164424b;
              }
              (this->state_).offset = this->read_end_;
            }
            if ((this->state_).offset == this->read_end_) {
              if (BVar1 != Custom) {
                this->last_known_section_ = BVar1;
              }
              bVar2 = false;
            }
            else {
              PrintError(this,"unfinished section (expected end: 0x%zx)",this->read_end_);
              Result::Result((Result *)((long)&this_local + 4),Error);
              bVar2 = true;
            }
          }
          else {
            PrintError(this,"BeginSection callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar2 = true;
          }
        }
        else {
          pcVar3 = GetSectionName((BinarySection)section_size);
          PrintError(this,"%s section can not occur after Name section",pcVar3);
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar2 = true;
        }
      }
      else {
        pcVar3 = GetSectionName((BinarySection)section_size);
        PrintError(this,"section %s out of order",pcVar3);
        Result::Result((Result *)((long)&this_local + 4),Error);
        bVar2 = true;
      }
    }
    else {
      PrintError(this,"invalid section code: %u; max is %u",(ulong)(BinarySection)section_size,0xb);
      Result::Result((Result *)((long)&this_local + 4),Error);
      bVar2 = true;
    }
LAB_0164424b:
    ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
    ~ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                        *)local_40);
    if (bVar2) {
      return (Result)this_local._4_4_;
    }
  } while( true );
}

Assistant:

Result BinaryReader::ReadSections() {
  Result result = Result::Ok;

  while (state_.offset < state_.size) {
    uint32_t section_code;
    Offset section_size;
    CHECK_RESULT(ReadU32Leb128(&section_code, "section code"));
    CHECK_RESULT(ReadOffset(&section_size, "section size"));
    ReadEndRestoreGuard guard(this);
    read_end_ = state_.offset + section_size;
    if (section_code >= kBinarySectionCount) {
      PrintError("invalid section code: %u; max is %u", section_code,
                 kBinarySectionCount - 1);
      return Result::Error;
    }

    BinarySection section = static_cast<BinarySection>(section_code);

    ERROR_UNLESS(read_end_ <= state_.size,
                 "invalid section size: extends past end");

    ERROR_UNLESS(last_known_section_ == BinarySection::Invalid ||
                     section == BinarySection::Custom ||
                     section > last_known_section_,
                 "section %s out of order", GetSectionName(section));

    ERROR_UNLESS(!did_read_names_section_ || section == BinarySection::Custom,
                 "%s section can not occur after Name section",
                 GetSectionName(section));

    CALLBACK(BeginSection, section, section_size);

    bool stop_on_first_error = options_.stop_on_first_error;
    Result section_result = Result::Error;
    switch (section) {
      case BinarySection::Custom:
        section_result = ReadCustomSection(section_size);
        if (options_.fail_on_custom_section_error) {
          result |= section_result;
        } else {
          stop_on_first_error = false;
        }
        break;
      case BinarySection::Type:
        section_result = ReadTypeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Import:
        section_result = ReadImportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Function:
        section_result = ReadFunctionSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Table:
        section_result = ReadTableSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Memory:
        section_result = ReadMemorySection(section_size);
        result |= section_result;
        break;
      case BinarySection::Global:
        section_result = ReadGlobalSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Export:
        section_result = ReadExportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Start:
        section_result = ReadStartSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Elem:
        section_result = ReadElemSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Code:
        section_result = ReadCodeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Data:
        section_result = ReadDataSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Invalid:
        WABT_UNREACHABLE;
    }

    if (Failed(section_result)) {
      if (stop_on_first_error) {
        return Result::Error;
      }

      // If we're continuing after failing to read this section, move the
      // offset to the expected section end. This way we may be able to read
      // further sections.
      state_.offset = read_end_;
    }

    ERROR_UNLESS(state_.offset == read_end_,
                 "unfinished section (expected end: 0x%" PRIzx ")", read_end_);

    if (section != BinarySection::Custom) {
      last_known_section_ = section;
    }
  }

  return result;
}